

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost.c
# Opt level: O0

int GetResidualCost_C(int ctx0,VP8Residual *res)

{
  uint8_t proba;
  long lVar1;
  int iVar2;
  int iVar3;
  int *in_RSI;
  int in_EDI;
  int last_p0;
  int ctx_1;
  int b;
  int v_1;
  int ctx;
  int v;
  int cost;
  uint16_t *t;
  CostArrayPtr costs;
  int p0;
  int n;
  int local_4c;
  int local_48;
  int local_2c;
  uint16_t *local_28;
  int local_14;
  int local_4;
  
  local_14 = *in_RSI;
  proba = *(uint8_t *)(*(long *)(in_RSI + 6) + (long)local_14 * 0x21 + (long)in_EDI * 0xb);
  lVar1 = *(long *)(in_RSI + 10);
  local_28 = *(uint16_t **)(lVar1 + (long)local_14 * 0x18 + (long)in_EDI * 8);
  if (in_EDI == 0) {
    local_48 = VP8BitCost(1,proba);
  }
  else {
    local_48 = 0;
  }
  local_2c = local_48;
  if (in_RSI[1] < 0) {
    local_4 = VP8BitCost(0,proba);
  }
  else {
    for (; local_14 < in_RSI[1]; local_14 = local_14 + 1) {
      iVar2 = (int)*(short *)(*(long *)(in_RSI + 2) + (long)local_14 * 2);
      if (iVar2 < 1) {
        iVar2 = -iVar2;
      }
      local_4c = iVar2;
      if (1 < iVar2) {
        local_4c = 2;
      }
      iVar2 = VP8LevelCost(local_28,iVar2);
      local_2c = iVar2 + local_2c;
      local_28 = *(uint16_t **)(lVar1 + (long)(local_14 + 1) * 0x18 + (long)local_4c * 8);
    }
    iVar2 = (int)*(short *)(*(long *)(in_RSI + 2) + (long)local_14 * 2);
    if (iVar2 < 1) {
      iVar2 = -iVar2;
    }
    iVar3 = VP8LevelCost(local_28,iVar2);
    local_2c = iVar3 + local_2c;
    if (local_14 < 0xf) {
      iVar3 = 2;
      if (iVar2 == 1) {
        iVar3 = 1;
      }
      iVar2 = VP8BitCost(0,*(uint8_t *)
                            (*(long *)(in_RSI + 6) + (long)(int)(uint)""[local_14 + 1] * 0x21 +
                            (long)iVar3 * 0xb));
      local_2c = iVar2 + local_2c;
    }
    local_4 = local_2c;
  }
  return local_4;
}

Assistant:

static int GetResidualCost_C(int ctx0, const VP8Residual* const res) {
  int n = res->first;
  // should be prob[VP8EncBands[n]], but it's equivalent for n=0 or 1
  const int p0 = res->prob[n][ctx0][0];
  CostArrayPtr const costs = res->costs;
  const uint16_t* t = costs[n][ctx0];
  // bit_cost(1, p0) is already incorporated in t[] tables, but only if ctx != 0
  // (as required by the syntax). For ctx0 == 0, we need to add it here or it'll
  // be missing during the loop.
  int cost = (ctx0 == 0) ? VP8BitCost(1, p0) : 0;

  if (res->last < 0) {
    return VP8BitCost(0, p0);
  }
  for (; n < res->last; ++n) {
    const int v = abs(res->coeffs[n]);
    const int ctx = (v >= 2) ? 2 : v;
    cost += VP8LevelCost(t, v);
    t = costs[n + 1][ctx];
  }
  // Last coefficient is always non-zero
  {
    const int v = abs(res->coeffs[n]);
    assert(v != 0);
    cost += VP8LevelCost(t, v);
    if (n < 15) {
      const int b = VP8EncBands[n + 1];
      const int ctx = (v == 1) ? 1 : 2;
      const int last_p0 = res->prob[b][ctx][0];
      cost += VP8BitCost(0, last_p0);
    }
  }
  return cost;
}